

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O3

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  jpeg_component_info *pjVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  boolean bVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  jpeg_component_info *pjVar18;
  JDIMENSION *pJVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  
  iVar15 = cinfo->global_state;
  if (iVar15 != 0xca) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = iVar15;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar10 = cinfo->scale_denom;
  uVar9 = cinfo->scale_num << 3;
  if (uVar10 < uVar9) {
    if (uVar10 * 2 < uVar9) {
      if (uVar10 * 3 < uVar9) {
        if (uVar10 * 4 < uVar9) {
          if (uVar10 * 5 < uVar9) {
            if (uVar10 * 6 < uVar9) {
              if (uVar10 * 7 < uVar9) {
                if (uVar10 * 8 < uVar9) {
                  if (uVar10 * 9 < uVar9) {
                    if (uVar10 * 10 < uVar9) {
                      if (uVar10 * 0xb < uVar9) {
                        if (uVar10 * 0xc < uVar9) {
                          if (uVar10 * 0xd < uVar9) {
                            if (uVar10 * 0xe < uVar9) {
                              if (uVar10 * 0xf < uVar9) {
                                lVar12 = jdiv_round_up((ulong)cinfo->image_width << 4,8);
                                cinfo->output_width = (JDIMENSION)lVar12;
                                lVar12 = jdiv_round_up((ulong)cinfo->image_height << 4,8);
                                cinfo->output_height = (JDIMENSION)lVar12;
                                cinfo->min_DCT_scaled_size = 0x10;
                                iVar15 = 0x10;
                              }
                              else {
                                lVar12 = jdiv_round_up((ulong)cinfo->image_width * 0xf,8);
                                cinfo->output_width = (JDIMENSION)lVar12;
                                lVar12 = jdiv_round_up((ulong)cinfo->image_height * 0xf,8);
                                cinfo->output_height = (JDIMENSION)lVar12;
                                cinfo->min_DCT_scaled_size = 0xf;
                                iVar15 = 0xf;
                              }
                            }
                            else {
                              lVar12 = jdiv_round_up((ulong)cinfo->image_width * 0xe,8);
                              cinfo->output_width = (JDIMENSION)lVar12;
                              lVar12 = jdiv_round_up((ulong)cinfo->image_height * 0xe,8);
                              cinfo->output_height = (JDIMENSION)lVar12;
                              cinfo->min_DCT_scaled_size = 0xe;
                              iVar15 = 0xe;
                            }
                          }
                          else {
                            lVar12 = jdiv_round_up((ulong)cinfo->image_width * 0xd,8);
                            cinfo->output_width = (JDIMENSION)lVar12;
                            lVar12 = jdiv_round_up((ulong)cinfo->image_height * 0xd,8);
                            cinfo->output_height = (JDIMENSION)lVar12;
                            cinfo->min_DCT_scaled_size = 0xd;
                            iVar15 = 0xd;
                          }
                        }
                        else {
                          lVar12 = jdiv_round_up((ulong)cinfo->image_width * 0xc,8);
                          cinfo->output_width = (JDIMENSION)lVar12;
                          lVar12 = jdiv_round_up((ulong)cinfo->image_height * 0xc,8);
                          cinfo->output_height = (JDIMENSION)lVar12;
                          cinfo->min_DCT_scaled_size = 0xc;
                          iVar15 = 0xc;
                        }
                      }
                      else {
                        lVar12 = jdiv_round_up((ulong)cinfo->image_width * 0xb,8);
                        cinfo->output_width = (JDIMENSION)lVar12;
                        lVar12 = jdiv_round_up((ulong)cinfo->image_height * 0xb,8);
                        cinfo->output_height = (JDIMENSION)lVar12;
                        cinfo->min_DCT_scaled_size = 0xb;
                        iVar15 = 0xb;
                      }
                    }
                    else {
                      lVar12 = jdiv_round_up((ulong)cinfo->image_width * 10,8);
                      cinfo->output_width = (JDIMENSION)lVar12;
                      lVar12 = jdiv_round_up((ulong)cinfo->image_height * 10,8);
                      cinfo->output_height = (JDIMENSION)lVar12;
                      cinfo->min_DCT_scaled_size = 10;
                      iVar15 = 10;
                    }
                  }
                  else {
                    lVar12 = jdiv_round_up((ulong)cinfo->image_width * 9,8);
                    cinfo->output_width = (JDIMENSION)lVar12;
                    lVar12 = jdiv_round_up((ulong)cinfo->image_height * 9,8);
                    cinfo->output_height = (JDIMENSION)lVar12;
                    cinfo->min_DCT_scaled_size = 9;
                    iVar15 = 9;
                  }
                }
                else {
                  lVar12 = jdiv_round_up((ulong)cinfo->image_width << 3,8);
                  cinfo->output_width = (JDIMENSION)lVar12;
                  lVar12 = jdiv_round_up((ulong)cinfo->image_height << 3,8);
                  cinfo->output_height = (JDIMENSION)lVar12;
                  cinfo->min_DCT_scaled_size = 8;
                  iVar15 = 8;
                }
                bVar5 = false;
                goto LAB_0012527f;
              }
              lVar12 = jdiv_round_up((ulong)cinfo->image_width * 7,8);
              cinfo->output_width = (JDIMENSION)lVar12;
              lVar12 = jdiv_round_up((ulong)cinfo->image_height * 7,8);
              cinfo->output_height = (JDIMENSION)lVar12;
              cinfo->min_DCT_scaled_size = 7;
              iVar15 = 7;
            }
            else {
              lVar12 = jdiv_round_up((ulong)cinfo->image_width * 6,8);
              cinfo->output_width = (JDIMENSION)lVar12;
              lVar12 = jdiv_round_up((ulong)cinfo->image_height * 6,8);
              cinfo->output_height = (JDIMENSION)lVar12;
              cinfo->min_DCT_scaled_size = 6;
              iVar15 = 6;
            }
          }
          else {
            lVar12 = jdiv_round_up((ulong)cinfo->image_width * 5,8);
            cinfo->output_width = (JDIMENSION)lVar12;
            lVar12 = jdiv_round_up((ulong)cinfo->image_height * 5,8);
            cinfo->output_height = (JDIMENSION)lVar12;
            cinfo->min_DCT_scaled_size = 5;
            iVar15 = 5;
          }
        }
        else {
          lVar12 = jdiv_round_up((ulong)cinfo->image_width << 2,8);
          cinfo->output_width = (JDIMENSION)lVar12;
          lVar12 = jdiv_round_up((ulong)cinfo->image_height << 2,8);
          cinfo->output_height = (JDIMENSION)lVar12;
          cinfo->min_DCT_scaled_size = 4;
          iVar15 = 4;
        }
      }
      else {
        lVar12 = jdiv_round_up((ulong)cinfo->image_width * 3,8);
        cinfo->output_width = (JDIMENSION)lVar12;
        lVar12 = jdiv_round_up((ulong)cinfo->image_height * 3,8);
        cinfo->output_height = (JDIMENSION)lVar12;
        cinfo->min_DCT_scaled_size = 3;
        iVar15 = 3;
      }
    }
    else {
      lVar12 = jdiv_round_up((ulong)cinfo->image_width * 2,8);
      cinfo->output_width = (JDIMENSION)lVar12;
      lVar12 = jdiv_round_up((ulong)cinfo->image_height * 2,8);
      cinfo->output_height = (JDIMENSION)lVar12;
      cinfo->min_DCT_scaled_size = 2;
      iVar15 = 2;
    }
  }
  else {
    lVar12 = jdiv_round_up((ulong)cinfo->image_width,8);
    cinfo->output_width = (JDIMENSION)lVar12;
    lVar12 = jdiv_round_up((ulong)cinfo->image_height,8);
    cinfo->output_height = (JDIMENSION)lVar12;
    cinfo->min_DCT_scaled_size = 1;
    iVar15 = 1;
  }
  bVar5 = true;
LAB_0012527f:
  auVar8 = _DAT_00158050;
  auVar7 = _DAT_00158040;
  auVar6 = _DAT_00158000;
  iVar16 = cinfo->num_components;
  if (0 < (long)iVar16) {
    pjVar2 = cinfo->comp_info;
    lVar12 = (long)iVar16 + -1;
    auVar20._8_4_ = (int)lVar12;
    auVar20._0_8_ = lVar12;
    auVar20._12_4_ = (int)((ulong)lVar12 >> 0x20);
    piVar13 = &pjVar2->DCT_scaled_size;
    uVar14 = 0;
    auVar20 = auVar20 ^ _DAT_00158050;
    do {
      auVar21._8_4_ = (int)uVar14;
      auVar21._0_8_ = uVar14;
      auVar21._12_4_ = (int)(uVar14 >> 0x20);
      auVar22 = (auVar21 | auVar6) ^ auVar8;
      iVar17 = auVar20._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar17 && auVar20._0_4_ < auVar22._0_4_ ||
                  iVar17 < auVar22._4_4_) & 1)) {
        *piVar13 = iVar15;
      }
      if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
          auVar22._12_4_ <= auVar20._12_4_) {
        piVar13[0x18] = iVar15;
      }
      auVar21 = (auVar21 | auVar7) ^ auVar8;
      iVar23 = auVar21._4_4_;
      if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar21._0_4_ <= auVar20._0_4_)) {
        piVar13[0x30] = iVar15;
        piVar13[0x48] = iVar15;
      }
      uVar14 = uVar14 + 4;
      piVar13 = piVar13 + 0x60;
    } while ((iVar16 + 3U & 0xfffffffc) != uVar14);
    if (0 < iVar16) {
      iVar17 = 0;
      pjVar18 = pjVar2;
      do {
        iVar23 = iVar15;
        if (bVar5) {
          do {
            if (((cinfo->max_h_samp_factor * iVar15) % (iVar23 * pjVar18->h_samp_factor * 2) != 0)
               || (iVar4 = iVar23 * 2,
                  (cinfo->max_v_samp_factor * iVar15) % (pjVar18->v_samp_factor * iVar4) != 0))
            break;
            bVar3 = iVar23 < 4;
            iVar23 = iVar4;
          } while (bVar3);
        }
        pjVar18->DCT_scaled_size = iVar23;
        iVar17 = iVar17 + 1;
        pjVar18 = pjVar18 + 1;
      } while (iVar17 != iVar16);
      if (0 < iVar16) {
        pJVar19 = &pjVar2->downsampled_height;
        iVar15 = 0;
        do {
          lVar12 = jdiv_round_up((long)(int)pJVar19[-2] * (long)(int)pJVar19[-9] *
                                 (ulong)cinfo->image_width,(long)cinfo->max_h_samp_factor << 3);
          pJVar19[-1] = (JDIMENSION)lVar12;
          lVar12 = jdiv_round_up((long)(int)pJVar19[-2] * (long)(int)pJVar19[-8] *
                                 (ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
          *pJVar19 = (JDIMENSION)lVar12;
          iVar15 = iVar15 + 1;
          iVar16 = cinfo->num_components;
          pJVar19 = pJVar19 + 0x18;
        } while (iVar15 < iVar16);
      }
    }
  }
  uVar10 = cinfo->out_color_space - JCS_GRAYSCALE;
  if (uVar10 < 0x10) {
    iVar16 = *(int *)(&DAT_00178d94 + (ulong)uVar10 * 4);
  }
  cinfo->out_color_components = iVar16;
  iVar15 = 1;
  if (cinfo->quantize_colors != 0) {
    iVar16 = 1;
  }
  cinfo->output_components = iVar16;
  bVar11 = use_merged_upsample(cinfo);
  if (bVar11 != 0) {
    iVar15 = cinfo->max_v_samp_factor;
  }
  cinfo->rec_outbuf_height = iVar15;
  return;
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions(j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = cinfo->_min_DCT_scaled_size;
    while (ssize < DCTSIZE &&
           ((cinfo->max_h_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->h_samp_factor * ssize * 2) == 0) &&
           ((cinfo->max_v_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->v_samp_factor * ssize * 2) == 0)) {
      ssize = ssize * 2;
    }
#if JPEG_LIB_VERSION >= 70
    compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size = ssize;
#else
    compptr->DCT_scaled_size = ssize;
#endif
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_width *
                    (long)(compptr->h_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_height *
                    (long)(compptr->v_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));
  }

#else /* !IDCT_SCALING_SUPPORTED */

  /* Hardwire it to "no scaling" */
  cinfo->output_width = cinfo->image_width;
  cinfo->output_height = cinfo->image_height;
  /* jdinput.c has already initialized DCT_scaled_size to DCTSIZE,
   * and has computed unscaled downsampled_width and downsampled_height.
   */

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    break;
  case JCS_YCbCr:
  case JCS_RGB565:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:                      /* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
                              cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}